

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

bool __thiscall wirehair::Codec::Triangle(Codec *this)

{
  ulong *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint8_t y;
  ushort uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t *puVar8;
  uint16_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int iVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong local_90;
  uint local_88;
  
  uVar19 = this->_next_pivot;
  uVar6 = this->_first_heavy_column;
  if (uVar19 < uVar6) {
    bVar13 = TriangleNonHeavy(this);
    if (!bVar13) {
      return false;
    }
    uVar19 = this->_next_pivot;
  }
  local_88 = this->_first_heavy_pivot;
  uVar7 = this->_pivot_count;
  uVar27 = (uint)this->_mix_count + (uint)this->_defer_count;
  iVar16 = (uint)this->_dense_count + (uint)this->_defer_count;
  local_90 = 1L << ((ulong)uVar19 & 0x3f);
  uVar21 = (ulong)uVar19;
  do {
    if (uVar27 <= uVar21) {
      return true;
    }
    puVar8 = this->_ge_matrix;
    uVar14 = (uint)uVar21;
    uVar20 = uVar21 >> 6 & 0x3ffffff;
    uVar26 = (ulong)local_88;
    uVar19 = this->_ge_pitch;
    uVar15 = uVar14 - uVar6;
    iVar12 = (int)uVar20;
    puVar9 = this->_pivots;
    uVar22 = uVar21;
LAB_00103760:
    uVar28 = (uint)uVar22;
    if (uVar22 < uVar26) {
      uVar4 = puVar9[uVar22];
      uVar17 = (ulong)(uVar19 * uVar4);
      uVar25 = puVar8[uVar20 + uVar17];
      if ((local_90 & uVar25) == 0) break;
      puVar9[uVar22] = puVar9[uVar21];
      puVar9[uVar21] = uVar4;
      while( true ) {
        uVar28 = uVar28 + 1;
        uVar22 = uVar22 + 1;
        if (uVar26 <= uVar22) break;
        uVar18 = (ulong)(puVar9[uVar22] * uVar19);
        if ((local_90 & puVar8[uVar20 + uVar18]) != 0) {
          puVar8[uVar20 + uVar18] = puVar8[uVar20 + uVar18] ^ uVar25 & -local_90 ^ local_90;
          for (uVar24 = 1; uVar24 < uVar19 - iVar12; uVar24 = uVar24 + 1) {
            puVar1 = (ulong *)((long)puVar8 + uVar24 * 8 + uVar18 * 8 + (ulong)(uint)(iVar12 * 8));
            *puVar1 = *puVar1 ^ *(ulong *)((long)puVar8 +
                                          uVar24 * 8 + uVar17 * 8 + (ulong)(uint)(iVar12 * 8));
          }
        }
      }
      uVar20 = local_90 >> 0x3f | local_90 << 1;
      uVar19 = uVar14 + 1;
      uVar22 = (ulong)((uVar14 & 0xfffffffc) + 4);
      for (uVar26 = (ulong)uVar28; uVar26 < uVar7; uVar26 = uVar26 + 1) {
        puVar10 = this->_heavy_matrix;
        uVar25 = (ulong)(((uint)this->_pivots[uVar26] - iVar16) * this->_heavy_pitch);
        bVar3 = puVar10[uVar15 + uVar25];
        if (bVar3 != 0) {
          uVar29 = this->_ge_pitch * (uint)uVar4;
          puVar8 = this->_ge_matrix;
          uVar17 = uVar20;
          uVar18 = (ulong)(uVar19 >> 6);
          uVar24 = (ulong)uVar19;
          uVar23 = local_90;
          uVar28 = uVar19;
          switch(uVar14 & 3) {
          case 0:
            uVar23 = uVar20;
            uVar28 = uVar14 + 2;
            if ((puVar8[(ulong)uVar29 + (ulong)(uVar19 >> 6)] & uVar20) != 0) {
              puVar10[(uVar19 - this->_first_heavy_column) + uVar25] =
                   puVar10[(uVar19 - this->_first_heavy_column) + uVar25] ^ bVar3;
            }
          case 1:
            uVar17 = uVar23 >> 0x3f | uVar23 << 1;
            if ((puVar8[(ulong)uVar29 + (ulong)(uVar28 >> 6)] & uVar17) != 0) {
              puVar10[(uVar28 - this->_first_heavy_column) + uVar25] =
                   puVar10[(uVar28 - this->_first_heavy_column) + uVar25] ^ bVar3;
            }
            uVar28 = uVar28 + 1;
            uVar17 = (uVar23 << 1) >> 0x3f | uVar17 << 1;
            uVar18 = (ulong)(uVar28 >> 6);
          case 2:
            uVar24 = uVar22;
            if ((puVar8[uVar29 + uVar18] & uVar17) != 0) {
              puVar10[(uVar28 - this->_first_heavy_column) + uVar25] =
                   puVar10[(uVar28 - this->_first_heavy_column) + uVar25] ^ bVar3;
            }
          case 3:
            for (; (uint)uVar24 < uVar27; uVar24 = uVar24 + 4) {
              *(uint *)(puVar10 + uVar24 + (uVar25 - uVar6)) =
                   *(uint *)(puVar10 + uVar24 + (uVar25 - uVar6)) ^
                   *(int *)(GF256_MULT_LOOKUP +
                           (ulong)((uint)(puVar8[(ulong)uVar29 + (uVar24 >> 6 & 0x3ffffff)] >>
                                         (uVar24 & 0x3f)) & 0xf) * 4) * (uint)bVar3;
            }
          }
        }
      }
    }
    else {
      puVar10 = this->_heavy_matrix;
      while( true ) {
        uVar28 = uVar28 + 1;
        if (this->_pivot_count <= uVar22) {
          this->_next_pivot = uVar14;
          this->_first_heavy_pivot = local_88;
          return false;
        }
        uVar4 = puVar9[uVar22];
        uVar19 = ((uint)uVar4 - iVar16) * this->_heavy_pitch;
        uVar2 = puVar10[(ulong)uVar15 + (ulong)uVar19];
        if (uVar2 != '\0') break;
        uVar22 = uVar22 + 1;
      }
      puVar9[uVar22] = puVar9[uVar21];
      puVar9[uVar21] = uVar4;
      if (uVar21 < uVar26) {
        uVar5 = puVar9[uVar26];
        local_88 = local_88 + 1;
        puVar9[uVar26] = puVar9[uVar22];
        puVar9[uVar22] = uVar5;
      }
      if (uVar28 < uVar7) {
        uVar14 = uVar15 + 1;
        for (uVar22 = (ulong)uVar28; uVar22 < uVar7; uVar22 = uVar22 + 1) {
          uVar28 = ((uint)this->_pivots[uVar22] - iVar16) * this->_heavy_pitch;
          puVar11 = this->_heavy_matrix;
          if (puVar11[(ulong)uVar15 + (ulong)uVar28] != '\0') {
            y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar2,puVar11[(ulong)uVar15 + (ulong)uVar28])];
            puVar11[(ulong)uVar15 + (ulong)uVar28] = y;
            gf256_muladd_mem(puVar11 + (ulong)uVar14 + (ulong)uVar28,y,
                             puVar10 + (ulong)uVar14 + (ulong)uVar19,this->_heavy_columns - uVar14);
          }
        }
      }
    }
    local_90 = local_90 >> 0x3f | local_90 << 1;
    uVar21 = uVar21 + 1;
  } while( true );
  uVar22 = uVar22 + 1;
  goto LAB_00103760;
}

Assistant:

bool Codec::Triangle()
{
    CAT_IF_DUMP(cout << endl << "---- Triangle ----" << endl << endl;)

    const unsigned first_heavy_column = _first_heavy_column;

    // If next pivot is not heavy:
    if (_next_pivot < first_heavy_column &&
        !TriangleNonHeavy())
    {
        return false;
    }

    const unsigned pivot_count = _pivot_count;
    const unsigned column_count = _defer_count + _mix_count;
    const unsigned first_heavy_row = _defer_count + _dense_count;
    unsigned first_heavy_pivot = _first_heavy_pivot;

    uint64_t ge_mask = (uint64_t)1 << (_next_pivot & 63);

    // For each heavy pivot to determine:
    for (unsigned pivot_i = _next_pivot; pivot_i < column_count;
        ++pivot_i, ge_mask = CAT_ROL64(ge_mask, 1))
    {
        CAT_DEBUG_ASSERT(pivot_i >= first_heavy_column);
        const unsigned heavy_col_i = pivot_i - first_heavy_column;

        const unsigned word_offset = pivot_i >> 6;
        uint64_t * GF256_RESTRICT ge_matrix_offset = _ge_matrix + word_offset;
        bool found = false;
        unsigned pivot_j;

        // For each remaining GE row that might be the pivot:
        for (pivot_j = pivot_i; pivot_j < first_heavy_pivot; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            uint64_t * GF256_RESTRICT ge_row = &ge_matrix_offset[_ge_pitch * ge_row_j];

            // If the bit was not found:
            if (0 == (*ge_row & ge_mask)) {
                continue; // Skip to next
            }

            // Found it!
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on row " << ge_row_j << endl;)

            // Swap out the pivot index for this one
            _pivots[pivot_j] = _pivots[pivot_i];
            CAT_DEBUG_ASSERT(ge_row_j < _pivot_count);
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // Prepare masked first word
            const uint64_t row0 = (*ge_row & ~(ge_mask - 1)) ^ ge_mask;

            unsigned pivot_k = pivot_j + 1;

            // For each remaining light row:
            for (; pivot_k < first_heavy_pivot; ++pivot_k)
            {
                // Determine if the row contains the bit we want
                unsigned ge_row_k = _pivots[pivot_k];
                uint64_t * GF256_RESTRICT rem_row = &ge_matrix_offset[_ge_pitch * ge_row_k];

                // If the bit was found:
                if (0 != (*rem_row & ge_mask))
                {
                    // Unroll first word to handle masked word and for speed
                    *rem_row ^= row0;

                    // Add the pivot row to eliminate the bit from this row, preserving previous bits
                    for (unsigned ii = 1, end = _ge_pitch - word_offset; ii < end; ++ii) {
                        rem_row[ii] ^= ge_row[ii];
                    }
                }
            } // next remaining row

            // For each remaining heavy row:
            for (; pivot_k < pivot_count; ++pivot_k)
            {
                CAT_DEBUG_ASSERT(_pivots[pivot_k] >= first_heavy_row);
                const unsigned heavy_row_k = _pivots[pivot_k] - first_heavy_row;

                uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                const uint8_t code_value = rem_row[heavy_col_i];

                // If the column is non-zero:
                if (0 == code_value) {
                    continue;
                }

                CAT_IF_DUMP(cout << "Eliminating from heavy row " << heavy_row_k << " :";)

                // For each set bit in the binary pivot row, add rem[i] to rem[i+]:
                uint64_t * GF256_RESTRICT pivot_row = &_ge_matrix[_ge_pitch * ge_row_j];

#if !defined(CAT_HEAVY_WIN_MULT)
                for (unsigned ge_column_i = pivot_i + 1; ge_column_i < column_count; ++ge_column_i)
                {
                    const uint64_t mask = (uint64_t)1 << (ge_column_i & 63);
                    const uint64_t word = pivot_row[ge_column_i >> 6];
                    const bool nonzero = 0 != (word & mask);

                    if (nonzero) {
                        rem_row[ge_column_i - first_heavy_column] ^= code_value;
                    }
                }
#else // CAT_HEAVY_WIN_MULT
                const unsigned odd_count = pivot_i & 3;
                unsigned ge_column_i = pivot_i + 1;
                uint64_t temp_mask = ge_mask;

                // Unroll odd columns:
                switch (odd_count)
                {
                case 0: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 1: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }
                        ++ge_column_i;

                        // Fall-thru...
                case 2: temp_mask = CAT_ROL64(temp_mask, 1);
                        if (0 != (pivot_row[ge_column_i >> 6] & temp_mask))
                        {
                            CAT_DEBUG_ASSERT(ge_column_i >= _first_heavy_column);
                            rem_row[ge_column_i - _first_heavy_column] ^= code_value;
                            CAT_IF_DUMP(cout << " " << ge_column_i;)
                        }

                        // Set GE column to next even column
                        CAT_DEBUG_ASSERT(odd_count <= 4);
                        ge_column_i = pivot_i + (4 - odd_count);
                }

                uint32_t * GF256_RESTRICT word = reinterpret_cast<uint32_t*>(rem_row + ge_column_i - first_heavy_column);

                // For remaining aligned columns:
                for (; ge_column_i < column_count; ge_column_i += 4, ++word)
                {
                    // Look up 4 bit window
                    const uint32_t bits = (uint32_t)(pivot_row[ge_column_i >> 6] >> (ge_column_i & 63)) & 15;
#if defined(CAT_ENDIAN_UNKNOWN)
                    const uint32_t window = getLE(GF256_MULT_LOOKUP[bits]);
#else
                    const uint32_t window = GF256_MULT_LOOKUP[bits];
#endif

                    CAT_IF_DUMP(cout << " " << ge_column_i << "x" << hex << setw(8) << setfill('0') << window << dec;)

                    *word ^= window * code_value;
                }
#endif // CAT_HEAVY_WIN_MULT
                CAT_IF_DUMP(cout << endl;)
            } // next heavy row

            break;
        } // next row

        // If not found, then for each remaining heavy pivot:
        // NOTE: The pivot array maintains the heavy rows at the end so that they are always tried last
        if (!found) for (; pivot_j < _pivot_count; ++pivot_j)
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
            const unsigned heavy_row_j = ge_row_j - first_heavy_row;
            CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
            uint8_t * GF256_RESTRICT pivot_row = &_heavy_matrix[_heavy_pitch * heavy_row_j];
            const uint8_t code_value = pivot_row[heavy_col_i];

            // If heavy row doesn't have the pivot:
            if (0 == code_value) {
                continue; // Skip to next
            }

            // Found it! (common case)
            found = true;

            CAT_IF_DUMP(cout << "Pivot " << pivot_i << " found on heavy row " << ge_row_j << endl;)

            // Swap pivot i and j
            _pivots[pivot_j] = _pivots[pivot_i];
            _pivots[pivot_i] = (uint16_t)ge_row_j;

            // If a non-heavy pivot just got moved into heavy pivot list:
            if (pivot_i < first_heavy_pivot)
            {
                // Swap pivot j with first heavy pivot
                const uint16_t temp = _pivots[first_heavy_pivot];
                _pivots[first_heavy_pivot] = _pivots[pivot_j];
                _pivots[pivot_j] = temp;

                // And move the first heavy pivot up one to cover the hole
                ++first_heavy_pivot;
            }

            unsigned pivot_k = pivot_j + 1;

            // If there are any remaining rows:
            if (pivot_k < pivot_count)
            {
                // For each remaining unused row:
                // Note all remaining rows are heavy rows by pivot array organization
                for (; pivot_k < pivot_count; ++pivot_k)
                {
                    const unsigned ge_row_k = _pivots[pivot_k];
                    CAT_DEBUG_ASSERT(ge_row_k >= first_heavy_row);
                    const unsigned heavy_row_k = ge_row_k - first_heavy_row;
                    CAT_DEBUG_ASSERT(heavy_row_k < _heavy_rows);
                    uint8_t * GF256_RESTRICT rem_row = &_heavy_matrix[_heavy_pitch * heavy_row_k];
                    const uint8_t rem_value = rem_row[heavy_col_i];

                    // If the column is zero:
                    if (0 == rem_value) {
                        continue; // Skip it
                    }

                    // x = rem_value / code_value
                    const uint8_t x = gf256_div(rem_value, code_value);

                    // Store value for later
                    rem_row[heavy_col_i] = x;

                    const unsigned offset = heavy_col_i + 1;
                    CAT_DEBUG_ASSERT(_heavy_columns >= offset);

                    // rem[i+] += x * pivot[i+]
                    gf256_muladd_mem(
                        rem_row + offset,
                        x,
                        pivot_row + offset,
                        _heavy_columns - offset);
                } // next remaining row
            }

            break;
        } // next heavy row

        // If pivot could not be found:
        if (!found)
        {
            _next_pivot = pivot_i;
            _first_heavy_pivot = first_heavy_pivot;

            CAT_IF_DUMP(cout << "Singular: Pivot " << pivot_i << " of " <<
                (_defer_count + _mix_count) << " not found!" << endl;)

            CAT_IF_PIVOT(if (pivot_i + 16 < (unsigned)(_defer_count + _mix_count)) {
                cout << ">>>>> Singular: Pivot " << pivot_i << " of " <<
                    (_defer_count + _mix_count) << " not found!" << endl << endl;
            })

            return false;
        }

        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )
    }

    return true;
}